

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::sendContextPool::put(sendContextPool *this,sendContext *s)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  iVar1 = s->poolIndex;
  __mutex = (pthread_mutex_t *)(this->pools + iVar1);
  std::mutex::lock((mutex *)&__mutex->__data);
  TCPSocket::sendContext::~sendContext(s);
  iVar1 = this->pools[iVar1].count;
  if (iVar1 < 10000) {
    __mutex[1].__data.__lock = iVar1 + 1;
    if (*(long *)((long)__mutex + 0x30) != 0) {
      s->next = *(sendContext **)(*(long *)((long)__mutex + 0x30) + 0x20);
    }
    *(sendContext **)((long)__mutex + 0x30) = s;
  }
  else {
    free(s);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void put(TCPSocket::sendContext *s) {
		auto index = s->poolIndex;
		pool &p = this->pools[index]; 
		std::lock_guard<std::mutex> guard(p.mtx);
		s->~sendContext();		
		if(p.count < itemCount){
			p.count++;
			if(nullptr != p.head){
				s->next = p.head->next;
			}
			p.head = s;
		} else {
			free((void*)s);
		}
	}